

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

string * units::generateUnitSequence(string *__return_storage_ptr__,double mux,string *seq)

{
  pointer pcVar1;
  double dVar2;
  _Alloc_hider __nptr;
  int iVar3;
  void *pvVar4;
  size_type sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ulong extraout_RAX;
  int *piVar7;
  long lVar8;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  undefined8 uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  char *pcVar11;
  undefined1 extraout_DL;
  bool numOnly;
  undefined1 uVar12;
  bool numOnly_00;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  bool numOnly_01;
  bool numOnly_02;
  bool numOnly_03;
  bool numOnly_04;
  undefined1 extraout_DL_02;
  bool numOnly_05;
  bool numOnly_06;
  bool numOnly_07;
  bool numOnly_08;
  undefined1 extraout_DL_03;
  bool numOnly_09;
  undefined1 extraout_DL_04;
  bool numOnly_10;
  size_t __n;
  size_type __pos;
  byte bVar13;
  char *__data;
  ulong uVar14;
  string muxstr;
  string local_98;
  int local_74;
  string local_70;
  string local_50;
  
  iVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,0,3,"m^3"
                 );
  if (iVar3 == 0) {
    if (0.1 < mux) {
LAB_00412c9d:
      bVar13 = 0;
    }
    else {
      pcVar11 = "L";
      sVar5 = 3;
LAB_00412c5d:
      bVar13 = 0;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                (seq,0,sVar5,pcVar11,1);
      mux = mux * 1000.0;
    }
  }
  else {
    iVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,0,4,
                    "m^-3");
    if (iVar3 == 0) {
      if (mux <= 100.0) goto LAB_00412c9d;
      pcVar11 = "L^-1";
      sVar5 = 4;
LAB_00412cc2:
      bVar13 = 0;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                (seq,0,sVar5,pcVar11,4);
      mux = mux / 1000.0;
    }
    else {
      iVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,0,5,
                      "kg^-1");
      if (iVar3 == 0) {
        bVar13 = 1;
        if (100.0 < mux) {
          pcVar11 = "g^-1";
          sVar5 = 5;
          goto LAB_00412cc2;
        }
      }
      else {
        bVar13 = 0;
        iVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,0
                          ,2,"kg");
        if (((iVar3 == 0) && (bVar13 = 1, mux <= 0.1)) &&
           ((seq->_M_string_length < 4 || ((seq->_M_dataplus)._M_p[2] != '^')))) {
          pcVar11 = "g";
          sVar5 = 2;
          goto LAB_00412c5d;
        }
      }
    }
  }
  pcVar11 = (seq->_M_dataplus)._M_p;
  if ((mux == 1.0) && (!NAN(mux))) {
    if (*pcVar11 == '/') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_replace_aux(seq,0,0,1,'1');
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (seq->_M_dataplus)._M_p;
    paVar10 = &seq->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 == paVar10) {
      uVar9 = *(undefined8 *)((long)&seq->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar10->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar9;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = seq->_M_string_length;
    (seq->_M_dataplus)._M_p = (pointer)paVar10;
    seq->_M_string_length = 0;
    (seq->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  __n = seq->_M_string_length;
  if (*pcVar11 == '/') {
    uVar14 = 0xffffffffffffffff;
    if (__n != 0) {
      pvVar4 = memchr(pcVar11,0x5e,__n);
      __n = (long)pvVar4 - (long)pcVar11;
      uVar14 = -(ulong)(pvVar4 == (void *)0x0) | __n;
    }
    uVar12 = (undefined1)__n;
    iVar3 = 1;
    if (uVar14 != 0xffffffffffffffff) {
      iVar3 = pcVar11[uVar14 + 1] + -0x30;
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    if (iVar3 == 3) {
      dVar2 = cbrt(1.0 / mux);
      getMultiplierString_abi_cxx11_(&local_70,(units *)(ulong)bVar13,dVar2,numOnly_03);
      generateUnitSequence();
      if ((extraout_RAX_01 & 1) == 0) {
LAB_004131a4:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                  (seq,1,0,local_50._M_dataplus._M_p,local_98._M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_98,0,local_98._M_string_length,"1",1);
      }
      else {
        getMultiplierString_abi_cxx11_(&local_50,(units *)0x1,mux,numOnly_04);
        generateUnitSequence();
      }
    }
    else if (iVar3 == 2) {
      dVar2 = 1.0 / mux;
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
        uVar12 = extraout_DL_02;
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      getMultiplierString_abi_cxx11_(&local_70,(units *)(ulong)bVar13,dVar2,(bool)uVar12);
      generateUnitSequence();
      if ((extraout_RAX_02 & 1) == 0) goto LAB_004131a4;
      getMultiplierString_abi_cxx11_(&local_50,(units *)0x1,mux,numOnly_05);
      generateUnitSequence();
    }
    else if (iVar3 == 1) {
      getMultiplierString_abi_cxx11_(&local_70,(units *)(ulong)bVar13,1.0 / mux,(bool)uVar12);
      generateUnitSequence();
      if ((extraout_RAX & 1) == 0) goto LAB_004131a4;
      getMultiplierString_abi_cxx11_(&local_50,(units *)0x1,mux,numOnly_00);
      generateUnitSequence();
    }
    else {
      getMultiplierString_abi_cxx11_(&local_70,(units *)0x1,mux,(bool)uVar12);
      generateUnitSequence();
    }
    std::operator+(__return_storage_ptr__,&local_98,seq);
LAB_00413380:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    if (__n == 0) {
      uVar14 = 0xffffffffffffffff;
      uVar12 = false;
    }
    else {
      pvVar4 = memchr(pcVar11,0x5e,__n);
      uVar14 = -(ulong)(pvVar4 == (void *)0x0) | (long)pvVar4 - (long)pcVar11;
      uVar12 = extraout_DL;
    }
    if (uVar14 == 0xffffffffffffffff) {
      getMultiplierString_abi_cxx11_(&local_98,(units *)(ulong)bVar13,mux,(bool)uVar12);
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_98,(seq->_M_dataplus)._M_p,seq->_M_string_length);
    }
    else {
      sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_first_of(seq,"*/)",0,3);
      if (uVar14 <= sVar5) {
        __pos = ((seq->_M_dataplus)._M_p[uVar14 + 1] == '(') + uVar14 + 1;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_98,seq,__pos,(sVar5 - __pos) + 1);
        __nptr._M_p = local_98._M_dataplus._M_p;
        piVar7 = __errno_location();
        local_74 = *piVar7;
        *piVar7 = 0;
        lVar8 = strtol(__nptr._M_p,(char **)&local_70,10);
        if (local_70._M_dataplus._M_p == __nptr._M_p) {
          std::__throw_invalid_argument("stoi");
LAB_004133ee:
          uVar9 = std::__throw_out_of_range("stoi");
          if ((int *)local_98._M_dataplus._M_p != piVar7) {
            operator_delete(local_98._M_dataplus._M_p,
                            CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                     local_98.field_2._M_local_buf[0]) + 1);
          }
          _Unwind_Resume(uVar9);
        }
        if (((int)lVar8 != lVar8) || (*piVar7 == 0x22)) goto LAB_004133ee;
        if (*piVar7 == 0) {
          *piVar7 = local_74;
        }
        paVar10 = &local_98.field_2;
        uVar12 = extraout_DL_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar10) {
          operator_delete(local_98._M_dataplus._M_p,
                          CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                   local_98.field_2._M_local_buf[0]) + 1);
          uVar12 = extraout_DL_01;
        }
        local_98._M_string_length = 0;
        local_98.field_2._M_local_buf[0] = '\0';
        local_98._M_dataplus._M_p = (pointer)paVar10;
        switch((int)lVar8) {
        default:
          getMultiplierString_abi_cxx11_(&local_70,(units *)0x1,mux,(bool)uVar12);
          generateUnitSequence();
          break;
        case 2:
          if (mux < 0.0) {
            dVar2 = sqrt(mux);
            uVar12 = extraout_DL_04;
          }
          else {
            dVar2 = SQRT(mux);
          }
          getMultiplierString_abi_cxx11_(&local_70,(units *)(ulong)bVar13,dVar2,(bool)uVar12);
          generateUnitSequence();
          if ((extraout_RAX_06 & 1) != 0) {
            getMultiplierString_abi_cxx11_(&local_50,(units *)0x1,mux,numOnly_10);
            generateUnitSequence();
          }
          break;
        case 3:
          dVar2 = cbrt(mux);
          getMultiplierString_abi_cxx11_(&local_70,(units *)(ulong)bVar13,dVar2,numOnly_07);
          generateUnitSequence();
          if ((extraout_RAX_04 & 1) != 0) {
            getMultiplierString_abi_cxx11_(&local_50,(units *)0x1,mux,numOnly_08);
            generateUnitSequence();
          }
          break;
        case -3:
          dVar2 = cbrt(1.0 / mux);
          getMultiplierString_abi_cxx11_(&local_70,(units *)(ulong)bVar13,dVar2,numOnly_01);
          generateUnitSequence();
          if ((extraout_RAX_00 & 1) != 0) {
            getMultiplierString_abi_cxx11_(&local_50,(units *)0x1,mux,numOnly_02);
            generateUnitSequence();
          }
          break;
        case -2:
          dVar2 = 1.0 / mux;
          if (dVar2 < 0.0) {
            dVar2 = sqrt(dVar2);
            uVar12 = extraout_DL_03;
          }
          else {
            dVar2 = SQRT(dVar2);
          }
          getMultiplierString_abi_cxx11_(&local_70,(units *)(ulong)bVar13,dVar2,(bool)uVar12);
          generateUnitSequence();
          if ((extraout_RAX_05 & 1) != 0) {
            getMultiplierString_abi_cxx11_(&local_50,(units *)0x1,mux,numOnly_09);
            generateUnitSequence();
          }
          break;
        case -1:
          getMultiplierString_abi_cxx11_(&local_70,(units *)(ulong)bVar13,1.0 / mux,(bool)uVar12);
          generateUnitSequence();
          if ((extraout_RAX_03 & 1) != 0) {
            getMultiplierString_abi_cxx11_(&local_50,(units *)0x1,mux,numOnly_06);
            generateUnitSequence();
          }
        }
        std::operator+(__return_storage_ptr__,&local_98,seq);
        goto LAB_00413380;
      }
      getMultiplierString_abi_cxx11_(&local_98,(units *)(ulong)bVar13,mux,numOnly);
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_98,(seq->_M_dataplus)._M_p,seq->_M_string_length);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pbVar6->_M_dataplus)._M_p;
    paVar10 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 == paVar10) {
      uVar9 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar10->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar9;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_98._M_dataplus._M_p,
                  CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                           local_98.field_2._M_local_buf[0]) + 1);
  return __return_storage_ptr__;
}

Assistant:

static std::string generateUnitSequence(double mux, std::string seq)
{
    bool noPrefix = false;
    // deal with a few common things
    if (seq.compare(0, 3, "m^3") == 0) {
        if (mux <= 0.1) {
            seq.replace(0, 3, "L");
            mux *= 1000.0;
        }
    } else if (seq.compare(0, 4, "m^-3") == 0) {
        if (mux > 100.0) {
            seq.replace(0, 4, "L^-1");
            mux /= 1000.0;
        }
    } else if (seq.compare(0, 5, "kg^-1") == 0) {
        if (mux > 100.0) {
            seq.replace(0, 5, "g^-1");
            mux /= 1000.0;
        } else {
            noPrefix = true;
        }
    } else if (seq.compare(0, 2, "kg") == 0) {
        if (mux <= 0.1) {
            if (seq.size() > 3 && seq[2] == '^') {
                noPrefix = true;
            } else {
                seq.replace(0, 2, "g");
                mux *= 1000.0;
            }
        } else {
            noPrefix = true;
        }
    }
    if (mux == 1.0) {
        if (seq.front() == '/') {
            seq.insert(seq.begin(), '1');
        }
        return seq;
    }
    if (seq.front() == '/') {
        int pw = 1;
        auto pwerloc = seq.find_first_of('^');
        if (pwerloc != std::string::npos) {
#ifdef UNITS_CONSTEXPR_IF_SUPPORTED
            if constexpr (
                detail::bitwidth::base_size == sizeof(std::uint32_t)) {
                pw = seq[pwerloc + 1] - '0';
            } else {
                if (seq.size() <= pwerloc + 2 ||
                    !isDigitCharacter(seq[pwerloc + 2])) {
                    pw = seq[pwerloc + 1] - '0';
                } else {
                    pw = 10;
                }
            }
#else
            if (detail::bitwidth::base_size == sizeof(std::uint32_t) ||
                seq.size() <= pwerloc + 2 ||
                !isDigitCharacter(seq[pwerloc + 2])) {
                pw = seq[pwerloc + 1] - '0';
            } else {
                pw = 10;
            }
#endif
        }
        std::string muxstr;
        switch (pw) {
            case 1:
                muxstr = getMultiplierString(1.0 / mux, noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            case 2:
                muxstr = getMultiplierString(std::sqrt(1.0 / mux), noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            case 3:
                muxstr = getMultiplierString(std::cbrt(1.0 / mux), noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            default:
                muxstr = getMultiplierString(mux, true);
        }
        return muxstr + seq;
    }
    auto pwerloc = seq.find_first_of('^');
    if (pwerloc == std::string::npos) {
        return getMultiplierString(mux, noPrefix) + seq;
    }
    auto mloc = seq.find_first_of("*/)");
    if (mloc < pwerloc) {
        return getMultiplierString(mux, noPrefix) + seq;
    }
    int offset = (seq[pwerloc + 1] != '(') ? 1 : 2;
    int pw = stoi(seq.substr(pwerloc + offset, mloc - pwerloc - offset + 1));
    std::string muxstr;
    switch (pw) {
        case -1:
            muxstr = getMultiplierString(1.0 / mux, noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case -2:
            muxstr = getMultiplierString(std::sqrt(1.0 / mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case -3:
            muxstr = getMultiplierString(std::cbrt(1.0 / mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case 2:
            muxstr = getMultiplierString(std::sqrt(mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case 3:
            muxstr = getMultiplierString(std::cbrt(mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        default:
            muxstr = getMultiplierString(mux, true);
    }
    return muxstr + seq;
}